

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void sysbvm_environment_setNewBinding
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t existentBinding;
  sysbvm_tuple_t local_20;
  
  if ((environment & 0xf) != 0 || environment == 0) {
    return;
  }
  local_20 = 0;
  if (((binding & 0xf) == 0 && binding != 0) && (7 < *(uint *)(binding + 0xc))) {
    sVar2 = *(sysbvm_tuple_t *)(binding + 0x10);
  }
  else {
    sVar2 = 0;
  }
  if (*(sysbvm_tuple_t *)(environment + 0x40) != 0) {
    _Var1 = sysbvm_identityDictionary_findAssociation
                      (*(sysbvm_tuple_t *)(environment + 0x40),sVar2,&local_20);
    if (_Var1) {
      sysbvm_error("Overriding existent symbol binding.");
    }
    sVar2 = *(sysbvm_tuple_t *)(environment + 0x40);
    if (sVar2 != 0) goto LAB_00116426;
  }
  sVar2 = sysbvm_identityDictionary_create(context);
  *(sysbvm_tuple_t *)(environment + 0x40) = sVar2;
LAB_00116426:
  sysbvm_identityDictionary_add(context,sVar2,binding);
  return;
}

Assistant:

SYSBVM_API void sysbvm_environment_setNewBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(!sysbvm_tuple_isNonNullPointer(environment))
        return;

    sysbvm_environment_t *environmentObject = (sysbvm_environment_t*)environment;
    sysbvm_tuple_t existentBinding = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t symbol = sysbvm_association_getKey(binding);

    if(environmentObject->symbolTable && sysbvm_identityDictionary_findAssociation(environmentObject->symbolTable, symbol, &existentBinding))
        sysbvm_error("Overriding existent symbol binding.");

    if(!environmentObject->symbolTable)
        environmentObject->symbolTable = sysbvm_identityDictionary_create(context);

    sysbvm_identityDictionary_add(context, environmentObject->symbolTable, binding);
}